

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

bool cmCMakePresetsGraphInternal::PresetVectorStringHelper
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  _func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_Value_ptr_cmJSONState_ptr
  *in_RCX;
  function<void_(const_Json::Value_*,_cmJSONState_*)> local_40;
  cmJSONState *local_20;
  cmJSONState *state_local;
  Value *value_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *out_local;
  
  local_20 = state;
  state_local = (cmJSONState *)value;
  value_local = (Value *)out;
  if (PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)
      ::helper_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)
                                 ::helper_abi_cxx11_);
    if (iVar2 != 0) {
      std::function<void(Json::Value_const*,cmJSONState*)>::
      function<void(&)(Json::Value_const*,cmJSONState*),void>
                ((function<void(Json::Value_const*,cmJSONState*)> *)&local_40,
                 cmCMakePresetsErrors::INVALID_PRESET);
      cmJSONHelperBuilder::
      Vector<std::__cxx11::string,bool(*)(std::__cxx11::string&,Json::Value_const*,cmJSONState*)>
                (&PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)
                  ::helper_abi_cxx11_,(cmJSONHelperBuilder *)&local_40,
                 (ErrorGenerator *)PresetStringHelper,in_RCX);
      std::function<void_(const_Json::Value_*,_cmJSONState_*)>::~function(&local_40);
      __cxa_atexit(std::
                   function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                   ::~function,
                   &PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)
                    ::helper_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)
                           ::helper_abi_cxx11_);
    }
  }
  bVar1 = std::
          function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
          ::operator()(&PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)
                        ::helper_abi_cxx11_,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)value_local,(Value *)state_local,local_20);
  return bVar1;
}

Assistant:

bool PresetVectorStringHelper(std::vector<std::string>& out,
                              const Json::Value* value, cmJSONState* state)
{
  static auto const helper = JSONHelperBuilder::Vector<std::string>(
    cmCMakePresetsErrors::INVALID_PRESET,
    cmCMakePresetsGraphInternal::PresetStringHelper);
  return helper(out, value, state);
}